

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
MeshLib::List<MeshLib::Token>::append(List<MeshLib::Token> *this,ListNode<MeshLib::Token> *tn)

{
  ListNode<MeshLib::Token> *pLVar1;
  List<MeshLib::Token> *pLVar2;
  ListNode<MeshLib::Token> *pLVar3;
  
  pLVar2 = this;
  pLVar1 = this->m_head;
  if (this->m_head != (ListNode<MeshLib::Token> *)0x0) {
    do {
      pLVar3 = pLVar1;
      pLVar1 = pLVar3->m_next;
    } while (pLVar1 != (ListNode<MeshLib::Token> *)0x0);
    pLVar2 = (List<MeshLib::Token> *)&pLVar3->m_next;
  }
  pLVar2->m_head = tn;
  tn->m_next = (ListNode<MeshLib::Token> *)0x0;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void List<T>::append( ListNode<T> * tn )
{
	if( m_head == NULL )
	{
		m_head = tn;
		m_head->next() = NULL;
		m_size ++;
		return;
	}

	ListNode<T> * n = m_head;
	while( n->next() != NULL )
	{
		n = n->next();
	}

	n->next() = tn;
	tn->next() = NULL;
	m_size ++;
}